

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O1

wchar_t * archive_entry_copy_fflags_text_w(archive_entry *entry,wchar_t *flags)

{
  wchar_t wVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  wchar_t *pwVar6;
  size_t sVar7;
  int *__s;
  long lVar8;
  size_t __n;
  wchar_t *pwVar9;
  unsigned_long *puVar10;
  bool bVar11;
  unsigned_long local_60;
  unsigned_long local_58;
  
  archive_mstring_copy_wcs(&entry->ae_fflags_text,flags);
  do {
    wVar1 = *flags;
    if (wVar1 < L' ') {
      if (wVar1 != L'\t') {
        if (wVar1 == L'\0') {
          local_58 = 0;
          local_60 = 0;
          pwVar6 = (wchar_t *)0x0;
          goto LAB_00143c92;
        }
LAB_00143b3e:
        pwVar6 = (wchar_t *)0x0;
        local_60 = 0;
        local_58 = 0;
        do {
          lVar8 = 0;
          while ((0x2c < (ulong)*(uint *)((long)flags + lVar8) ||
                 ((0x100100000201U >> ((ulong)*(uint *)((long)flags + lVar8) & 0x3f) & 1) == 0))) {
            lVar8 = lVar8 + 4;
          }
          pwVar9 = (wchar_t *)((long)flags + lVar8);
          __n = lVar8 >> 2;
          bVar11 = false;
          puVar10 = &::flags[0].set;
          __s = anon_var_dwarf_aabf8;
          do {
            sVar7 = wcslen(__s);
            if ((__n == sVar7) && (iVar5 = wmemcmp(flags,__s,__n), iVar5 == 0)) {
              uVar3 = *puVar10;
              uVar2 = puVar10[1];
LAB_00143c27:
              local_58 = local_58 | uVar2;
              local_60 = local_60 | uVar3;
              bVar4 = false;
            }
            else {
              bVar4 = true;
              if ((__n == sVar7 - 2) && (iVar5 = wmemcmp(flags,__s + 2,__n), iVar5 == 0)) {
                uVar2 = *puVar10;
                uVar3 = puVar10[1];
                goto LAB_00143c27;
              }
            }
            if (!bVar4) break;
            __s = (int *)puVar10[3];
            puVar10 = puVar10 + 4;
            bVar11 = __s == (wchar_t *)0x0;
          } while (!bVar11);
          while( true ) {
            wVar1 = *pwVar9;
            if ((0x2c < (ulong)(uint)wVar1) ||
               ((0x100100000200U >> ((ulong)(uint)wVar1 & 0x3f) & 1) == 0)) break;
            pwVar9 = pwVar9 + 1;
          }
          if (pwVar6 != (wchar_t *)0x0) {
            flags = pwVar6;
          }
          if (bVar11) {
            pwVar6 = flags;
          }
          flags = pwVar9;
        } while (wVar1 != L'\0');
LAB_00143c92:
        entry->ae_fflags_set = local_58;
        entry->ae_fflags_clear = local_60;
        return pwVar6;
      }
    }
    else if ((wVar1 != L' ') && (wVar1 != L',')) goto LAB_00143b3e;
    flags = flags + 1;
  } while( true );
}

Assistant:

const wchar_t *
archive_entry_copy_fflags_text_w(struct archive_entry *entry,
    const wchar_t *flags)
{
	archive_mstring_copy_wcs(&entry->ae_fflags_text, flags);
	return (ae_wcstofflags(flags,
		    &entry->ae_fflags_set, &entry->ae_fflags_clear));
}